

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::ObjectIntersectorK<4,_false>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  NodeRef *pNVar5;
  NodeRef *pNVar6;
  NodeRef *pNVar7;
  undefined4 uVar8;
  uint uVar9;
  int iVar10;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar22;
  size_t sVar23;
  size_t sVar24;
  _func_int **pp_Var25;
  long lVar26;
  size_t sVar27;
  size_t sVar28;
  size_t sVar29;
  ulong uVar30;
  ulong uVar31;
  NodeRef nodeRef;
  NodeRef *pNVar32;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar33;
  bool bVar34;
  byte bVar35;
  byte bVar36;
  ushort uVar37;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar84;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar92 [64];
  vint4 ai_2;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  vint4 ai;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  vint4 ai_1;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  vint4 ai_3;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  vint4 bi;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  vint4 bi_1;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  vint4 bi_3;
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  vint4 bi_2;
  undefined4 uVar118;
  undefined4 uVar122;
  undefined4 uVar123;
  undefined4 uVar124;
  undefined4 uVar125;
  undefined4 uVar126;
  undefined1 auVar121 [64];
  undefined1 auVar127 [64];
  int in_XMM11_Da;
  int in_XMM11_Db;
  int in_XMM11_Dc;
  int in_XMM11_Dd;
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [16];
  undefined1 auVar131 [64];
  float fVar132;
  float fVar135;
  vint4 bi_8;
  undefined1 auVar134 [64];
  float fVar136;
  float fVar139;
  undefined1 auVar138 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  RTCIntersectFunctionNArguments local_35b0;
  Geometry *local_3580;
  undefined8 local_3578;
  RTCIntersectArguments *local_3570;
  undefined1 local_3568 [16];
  undefined1 local_3558 [16];
  undefined1 local_3548 [16];
  undefined1 local_3538 [16];
  undefined1 local_3528 [16];
  undefined1 local_3518 [16];
  undefined1 local_3508 [16];
  undefined1 local_34f8 [16];
  vint<4> mask;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  float fVar2;
  float fVar3;
  float fVar4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar53;
  undefined1 auVar71 [16];
  undefined1 auVar93 [64];
  undefined8 uVar119;
  undefined1 auVar154 [16];
  undefined1 auVar120 [32];
  undefined1 auVar133 [16];
  undefined1 auVar137 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    auVar48 = in_ZMM0._0_16_;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar48 = vpcmpeqd_avx(auVar48,auVar48);
      uVar38 = vpcmpeqd_avx512vl(auVar48,(undefined1  [16])valid_i->field_0);
      stack_node[0x1c1].ptr = uVar38 & 0xf;
      if ((byte)stack_node[0x1c1].ptr == 0) {
        return;
      }
      stack_node[0x1c0].ptr = (size_t)This->ptr;
      auVar46 = *(undefined1 (*) [16])(ray + 0x20);
      auVar52 = *(undefined1 (*) [16])(ray + 0x40);
      auVar68._8_4_ = 0x7fffffff;
      auVar68._0_8_ = 0x7fffffff7fffffff;
      auVar68._12_4_ = 0x7fffffff;
      auVar47 = vandps_avx(auVar52,auVar68);
      auVar109._8_4_ = 0x219392ef;
      auVar109._0_8_ = 0x219392ef219392ef;
      auVar109._12_4_ = 0x219392ef;
      uVar38 = vcmpps_avx512vl(auVar47,auVar109,1);
      auVar47 = *(undefined1 (*) [16])(ray + 0x50);
      auVar42 = vblendmps_avx512vl(auVar52,auVar109);
      bVar12 = (bool)((byte)uVar38 & 1);
      auVar44._0_4_ = (uint)bVar12 * auVar42._0_4_ | (uint)!bVar12 * in_XMM11_Da;
      bVar12 = (bool)((byte)(uVar38 >> 1) & 1);
      auVar44._4_4_ = (uint)bVar12 * auVar42._4_4_ | (uint)!bVar12 * in_XMM11_Db;
      bVar12 = (bool)((byte)(uVar38 >> 2) & 1);
      auVar44._8_4_ = (uint)bVar12 * auVar42._8_4_ | (uint)!bVar12 * in_XMM11_Dc;
      bVar12 = (bool)((byte)(uVar38 >> 3) & 1);
      auVar44._12_4_ = (uint)bVar12 * auVar42._12_4_ | (uint)!bVar12 * in_XMM11_Dd;
      auVar42 = vandps_avx(auVar47,auVar68);
      uVar38 = vcmpps_avx512vl(auVar42,auVar109,1);
      bVar12 = (bool)((byte)uVar38 & 1);
      auVar49._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar47._0_4_;
      bVar12 = (bool)((byte)(uVar38 >> 1) & 1);
      auVar49._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar47._4_4_;
      bVar12 = (bool)((byte)(uVar38 >> 2) & 1);
      auVar49._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar47._8_4_;
      bVar12 = (bool)((byte)(uVar38 >> 3) & 1);
      auVar49._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar47._12_4_;
      auVar47 = *(undefined1 (*) [16])(ray + 0x60);
      auVar42 = vandps_avx(auVar47,auVar68);
      uVar38 = vcmpps_avx512vl(auVar42,auVar109,1);
      bVar12 = (bool)((byte)uVar38 & 1);
      auVar50._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar47._0_4_;
      bVar12 = (bool)((byte)(uVar38 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar47._4_4_;
      bVar12 = (bool)((byte)(uVar38 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar47._8_4_;
      bVar12 = (bool)((byte)(uVar38 >> 3) & 1);
      auVar50._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar47._12_4_;
      auVar42 = vrcp14ps_avx512vl(auVar44);
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = &DAT_3f8000003f800000;
      auVar105._12_4_ = 0x3f800000;
      auVar68 = ZEXT816(0) << 0x40;
      auVar47 = vfnmadd213ps_fma(auVar44,auVar42,auVar105);
      auVar42 = vfmadd132ps_fma(auVar47,auVar42,auVar42);
      auVar127 = ZEXT1664(auVar42);
      auVar44 = vrcp14ps_avx512vl(auVar49);
      auVar47 = vfnmadd213ps_fma(auVar49,auVar44,auVar105);
      auVar44 = vfmadd132ps_fma(auVar47,auVar44,auVar44);
      auVar121 = ZEXT1664(auVar44);
      auVar49 = vrcp14ps_avx512vl(auVar50);
      auVar47 = vfnmadd213ps_fma(auVar50,auVar49,auVar105);
      auVar49 = vfmadd132ps_fma(auVar47,auVar49,auVar49);
      auVar128 = ZEXT1664(auVar49);
      auVar52 = vcmpps_avx(auVar52,auVar68,1);
      auVar47._8_4_ = 1;
      auVar47._0_8_ = 0x100000001;
      auVar47._12_4_ = 1;
      auVar50 = vandps_avx512vl(auVar52,auVar47);
      uVar38 = vcmpps_avx512vl(auVar68,*(undefined1 (*) [16])(ray + 0x50),0xe);
      auVar110._8_4_ = 2;
      auVar110._0_8_ = 0x200000002;
      auVar110._12_4_ = 2;
      auVar47 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar68);
      stack_node[0x1d7].ptr = auVar47._0_8_;
      stack_node[0x1d8].ptr = auVar47._8_8_;
      auVar52 = vpsubd_avx512vl(auVar110,auVar52);
      bVar12 = (bool)((byte)uVar38 & 1);
      auVar51._0_4_ = (uint)bVar12 * auVar52._0_4_ | (uint)!bVar12 * auVar50._0_4_;
      bVar12 = (bool)((byte)(uVar38 >> 1) & 1);
      auVar51._4_4_ = (uint)bVar12 * auVar52._4_4_ | (uint)!bVar12 * auVar50._4_4_;
      bVar12 = (bool)((byte)(uVar38 >> 2) & 1);
      auVar51._8_4_ = (uint)bVar12 * auVar52._8_4_ | (uint)!bVar12 * auVar50._8_4_;
      bVar12 = (bool)((byte)(uVar38 >> 3) & 1);
      auVar51._12_4_ = (uint)bVar12 * auVar52._12_4_ | (uint)!bVar12 * auVar50._12_4_;
      uVar38 = vcmpps_avx512vl(auVar68,*(undefined1 (*) [16])(ray + 0x60),0xe);
      auVar52._8_4_ = 4;
      auVar52._0_8_ = 0x400000004;
      auVar52._12_4_ = 4;
      auVar52 = vpord_avx512vl(auVar51,auVar52);
      bVar12 = (bool)((byte)uVar38 & 1);
      auVar66._0_4_ = (uint)bVar12 * auVar52._0_4_ | !bVar12 * auVar51._0_4_;
      bVar12 = (bool)((byte)(uVar38 >> 1) & 1);
      auVar66._4_4_ = (uint)bVar12 * auVar52._4_4_ | !bVar12 * auVar51._4_4_;
      bVar12 = (bool)((byte)(uVar38 >> 2) & 1);
      auVar66._8_4_ = (uint)bVar12 * auVar52._8_4_ | !bVar12 * auVar51._8_4_;
      bVar12 = (bool)((byte)(uVar38 >> 3) & 1);
      auVar66._12_4_ = (uint)bVar12 * auVar52._12_4_ | !bVar12 * auVar51._12_4_;
      auVar52 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar68);
      stack_node[0x1d5].ptr = auVar52._0_8_;
      stack_node[0x1d6].ptr = auVar52._8_8_;
      auVar52 = vmovdqa32_avx512vl(auVar66);
      bVar12 = (bool)((byte)stack_node[0x1c1].ptr & 1);
      bVar34 = (bool)((byte)(stack_node[0x1c1].ptr >> 1) & 1);
      bVar14 = (bool)((byte)(stack_node[0x1c1].ptr >> 2) & 1);
      bVar15 = SUB81(stack_node[0x1c1].ptr >> 3,0);
      stack_node[0x1c9].ptr._0_4_ = (uint)bVar12 * auVar52._0_4_ | (uint)!bVar12 * auVar48._0_4_;
      stack_node[0x1c9].ptr._4_4_ = (uint)bVar34 * auVar52._4_4_ | (uint)!bVar34 * auVar48._4_4_;
      stack_node[0x1ca].ptr._0_4_ = (uint)bVar14 * auVar52._8_4_ | (uint)!bVar14 * auVar48._8_4_;
      stack_node[0x1ca].ptr._4_4_ = (uint)bVar15 * auVar52._12_4_ | (uint)!bVar15 * auVar48._12_4_;
      stack_node[0x1dd].ptr._0_4_ = *(float *)ray;
      stack_node[0x1dd].ptr._4_4_ = *(float *)(ray + 4);
      stack_node[0x1de].ptr._0_4_ = *(float *)(ray + 8);
      stack_node[0x1de].ptr._4_4_ = *(float *)(ray + 0xc);
      fVar132 = auVar42._0_4_ * -*(float *)ray;
      fVar135 = auVar42._4_4_ * -*(float *)(ray + 4);
      auVar133._0_8_ = CONCAT44(fVar135,fVar132);
      auVar133._8_4_ = auVar42._8_4_ * -*(float *)(ray + 8);
      auVar133._12_4_ = auVar42._12_4_ * -*(float *)(ray + 0xc);
      auVar129 = ZEXT1664(auVar133);
      stack_node[0x1db].ptr._0_4_ = *(float *)(ray + 0x10);
      stack_node[0x1db].ptr._4_4_ = *(float *)(ray + 0x14);
      stack_node[0x1dc].ptr._0_4_ = *(float *)(ray + 0x18);
      stack_node[0x1dc].ptr._4_4_ = *(float *)(ray + 0x1c);
      fVar136 = auVar44._0_4_ * -*(float *)(ray + 0x10);
      fVar139 = auVar44._4_4_ * -*(float *)(ray + 0x14);
      auVar137._0_8_ = CONCAT44(fVar139,fVar136);
      auVar137._8_4_ = auVar44._8_4_ * -*(float *)(ray + 0x18);
      auVar137._12_4_ = auVar44._12_4_ * -*(float *)(ray + 0x1c);
      auVar131 = ZEXT1664(auVar137);
      stack_node[0x1d9].ptr = auVar46._0_8_;
      stack_node[0x1da].ptr = auVar46._8_8_;
      auVar48._0_8_ = auVar46._0_8_ ^ 0x8000000080000000;
      auVar48._8_4_ = auVar46._8_4_ ^ 0x80000000;
      auVar48._12_4_ = auVar46._12_4_ ^ 0x80000000;
      auVar48 = vmulps_avx512vl(auVar49,auVar48);
      auVar134 = ZEXT1664(auVar48);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar138 = ZEXT1664(auVar46);
      stack_node[0x1ba].ptr = 8;
      stack_node[0x1c3].ptr = (size_t)context;
      stack_node[0x1c2].ptr = (size_t)ray;
      stack_node[0x1e9].ptr = auVar44._0_8_;
      stack_node[0x1ea].ptr = auVar44._8_8_;
      stack_node[0x1e7].ptr = auVar42._0_8_;
      stack_node[0x1e8].ptr = auVar42._8_8_;
      stack_node[0x1e5].ptr = auVar49._0_8_;
      stack_node[0x1e6].ptr = auVar49._8_8_;
      stack_node[0x1e3].ptr = auVar133._0_8_;
      stack_node[0x1e4].ptr = auVar133._8_8_;
      stack_node[0x1e1].ptr = auVar137._0_8_;
      stack_node[0x1e2].ptr = auVar137._8_8_;
      stack_node[0x1df].ptr = auVar48._0_8_;
      stack_node[0x1e0].ptr = auVar48._8_8_;
LAB_00861a64:
      lVar26 = 0;
      for (uVar38 = stack_node[0x1c1].ptr; (uVar38 & 1) == 0;
          uVar38 = uVar38 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      iVar10 = *(int *)((long)&stack_node[0x1c9].ptr + lVar26 * 4);
      auVar88._4_4_ = iVar10;
      auVar88._0_4_ = iVar10;
      auVar88._8_4_ = iVar10;
      auVar88._12_4_ = iVar10;
      auVar46._4_4_ = stack_node[0x1c9].ptr._4_4_;
      auVar46._0_4_ = (uint)stack_node[0x1c9].ptr;
      auVar46._8_4_ = (uint)stack_node[0x1ca].ptr;
      auVar46._12_4_ = stack_node[0x1ca].ptr._4_4_;
      uVar31 = vpcmpeqd_avx512vl(auVar88,auVar46);
      uVar31 = uVar31 & 0xf;
      bVar36 = (byte)uVar31;
      stack_node[0x1c1].ptr = (long)(char)~bVar36 & stack_node[0x1c1].ptr;
      auVar49 = auVar138._0_16_;
      auVar48 = vblendmps_avx512vl(auVar49,auVar127._0_16_);
      auVar42._0_4_ = (uint)(bVar36 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar36 & 1) * iVar10;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar42._4_4_ = (uint)bVar12 * auVar48._4_4_ | (uint)!bVar12 * iVar10;
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar42._8_4_ = (uint)bVar12 * auVar48._8_4_ | (uint)!bVar12 * iVar10;
      bVar12 = SUB81(uVar31 >> 3,0);
      auVar42._12_4_ = (uint)bVar12 * auVar48._12_4_ | (uint)!bVar12 * iVar10;
      auVar48 = vshufps_avx(auVar42,auVar42,0xb1);
      auVar48 = vminps_avx(auVar48,auVar42);
      auVar46 = vshufpd_avx(auVar48,auVar48,1);
      auVar48 = vminps_avx(auVar46,auVar48);
      auVar52 = vblendmps_avx512vl(auVar49,auVar121._0_16_);
      auVar54._0_4_ = (uint)(bVar36 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar46._0_4_
      ;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar54._4_4_ = (uint)bVar12 * auVar52._4_4_ | (uint)!bVar12 * auVar46._4_4_;
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar54._8_4_ = (uint)bVar12 * auVar52._8_4_ | (uint)!bVar12 * auVar46._8_4_;
      bVar12 = SUB81(uVar31 >> 3,0);
      auVar54._12_4_ = (uint)bVar12 * auVar52._12_4_ | (uint)!bVar12 * auVar46._12_4_;
      auVar46 = vshufps_avx(auVar54,auVar54,0xb1);
      auVar46 = vminps_avx(auVar46,auVar54);
      auVar52 = vshufpd_avx(auVar46,auVar46,1);
      auVar46 = vminps_avx(auVar52,auVar46);
      auVar48 = vinsertps_avx(auVar48,auVar46,0x1c);
      auVar52 = vblendmps_avx512vl(auVar49,auVar128._0_16_);
      auVar55._0_4_ = (uint)(bVar36 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar46._0_4_
      ;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar55._4_4_ = (uint)bVar12 * auVar52._4_4_ | (uint)!bVar12 * auVar46._4_4_;
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar55._8_4_ = (uint)bVar12 * auVar52._8_4_ | (uint)!bVar12 * auVar46._8_4_;
      bVar12 = SUB81(uVar31 >> 3,0);
      auVar55._12_4_ = (uint)bVar12 * auVar52._12_4_ | (uint)!bVar12 * auVar46._12_4_;
      auVar46 = vshufps_avx(auVar55,auVar55,0xb1);
      auVar46 = vminps_avx(auVar46,auVar55);
      auVar52 = vshufpd_avx(auVar46,auVar46,1);
      auVar46 = vminps_avx(auVar52,auVar46);
      auVar48 = vinsertps_avx(auVar48,auVar46,0x20);
      auVar130._8_4_ = 0xff800000;
      auVar130._0_8_ = 0xff800000ff800000;
      auVar130._12_4_ = 0xff800000;
      auVar52 = vblendmps_avx512vl(auVar130,auVar127._0_16_);
      auVar56._0_4_ = (uint)(bVar36 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar46._0_4_
      ;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar56._4_4_ = (uint)bVar12 * auVar52._4_4_ | (uint)!bVar12 * auVar46._4_4_;
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar56._8_4_ = (uint)bVar12 * auVar52._8_4_ | (uint)!bVar12 * auVar46._8_4_;
      bVar12 = SUB81(uVar31 >> 3,0);
      auVar56._12_4_ = (uint)bVar12 * auVar52._12_4_ | (uint)!bVar12 * auVar46._12_4_;
      auVar46 = vshufps_avx(auVar56,auVar56,0xb1);
      auVar46 = vmaxps_avx(auVar46,auVar56);
      auVar52 = vshufpd_avx(auVar46,auVar46,1);
      auVar46 = vmaxps_avx(auVar52,auVar46);
      auVar47 = vblendmps_avx512vl(auVar130,auVar121._0_16_);
      auVar57._0_4_ = (uint)(bVar36 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar52._0_4_
      ;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar57._4_4_ = (uint)bVar12 * auVar47._4_4_ | (uint)!bVar12 * auVar52._4_4_;
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar57._8_4_ = (uint)bVar12 * auVar47._8_4_ | (uint)!bVar12 * auVar52._8_4_;
      bVar12 = SUB81(uVar31 >> 3,0);
      auVar57._12_4_ = (uint)bVar12 * auVar47._12_4_ | (uint)!bVar12 * auVar52._12_4_;
      auVar52 = vshufps_avx(auVar57,auVar57,0xb1);
      auVar52 = vmaxps_avx(auVar52,auVar57);
      auVar47 = vshufpd_avx(auVar52,auVar52,1);
      auVar52 = vmaxps_avx(auVar47,auVar52);
      auVar46 = vinsertps_avx(auVar46,auVar52,0x1c);
      auVar47 = vblendmps_avx512vl(auVar130,auVar128._0_16_);
      auVar58._0_4_ = (uint)(bVar36 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar52._0_4_
      ;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar58._4_4_ = (uint)bVar12 * auVar47._4_4_ | (uint)!bVar12 * auVar52._4_4_;
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar58._8_4_ = (uint)bVar12 * auVar47._8_4_ | (uint)!bVar12 * auVar52._8_4_;
      bVar12 = SUB81(uVar31 >> 3,0);
      auVar58._12_4_ = (uint)bVar12 * auVar47._12_4_ | (uint)!bVar12 * auVar52._12_4_;
      auVar52 = vshufps_avx(auVar58,auVar58,0xb1);
      auVar52 = vmaxps_avx(auVar52,auVar58);
      auVar47 = vshufpd_avx(auVar52,auVar52,1);
      auVar52 = vmaxps_avx(auVar47,auVar52);
      auVar46 = vinsertps_avx(auVar46,auVar52,0x20);
      uVar38 = vcmpps_avx512vl(auVar48,ZEXT816(0) << 0x20,5);
      auVar52 = vblendmps_avx512vl(auVar46,auVar48);
      bVar35 = (byte)uVar38;
      fVar1 = (float)((uint)(bVar35 & 1) * auVar52._0_4_);
      fVar2 = (float)((uint)((byte)(uVar38 >> 1) & 1) * auVar52._4_4_);
      auVar59._4_4_ = fVar2;
      auVar59._0_4_ = fVar1;
      fVar3 = (float)((uint)((byte)(uVar38 >> 2) & 1) * auVar52._8_4_);
      auVar59._8_4_ = fVar3;
      fVar4 = (float)((uint)((byte)(uVar38 >> 3) & 1) * auVar52._12_4_);
      auVar59._12_4_ = fVar4;
      auVar50 = vmovshdup_avx(auVar59);
      stack_node[0x1c8].ptr = (ulong)(auVar50._0_4_ < 0.0) << 5 | 0x40;
      auVar52 = vshufpd_avx(auVar59,auVar59,1);
      uVar39 = (ulong)(auVar52._0_4_ < 0.0) << 5 | 0x80;
      stack_node[0x1c7].ptr = stack_node[0x1c8].ptr ^ 0x20;
      auVar21._4_4_ = stack_node[0x1dd].ptr._4_4_;
      auVar21._0_4_ = (float)stack_node[0x1dd].ptr;
      auVar21._8_4_ = (float)stack_node[0x1de].ptr;
      auVar21._12_4_ = stack_node[0x1de].ptr._4_4_;
      auVar47 = vblendmps_avx512vl(auVar49,auVar21);
      auVar60._0_4_ =
           (uint)(bVar36 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar36 & 1) * (int)auVar52._0_4_;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar60._4_4_ = (uint)bVar12 * auVar47._4_4_ | (uint)!bVar12 * auVar52._4_4_;
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar60._8_4_ = (uint)bVar12 * auVar47._8_4_ | (uint)!bVar12 * auVar52._8_4_;
      bVar12 = SUB81(uVar31 >> 3,0);
      auVar60._12_4_ = (uint)bVar12 * auVar47._12_4_ | (uint)!bVar12 * auVar52._12_4_;
      auVar52 = vshufps_avx(auVar60,auVar60,0xb1);
      auVar52 = vminps_avx(auVar52,auVar60);
      auVar47 = vshufpd_avx(auVar52,auVar52,1);
      auVar52 = vminps_avx(auVar47,auVar52);
      auVar20._4_4_ = stack_node[0x1db].ptr._4_4_;
      auVar20._0_4_ = (float)stack_node[0x1db].ptr;
      auVar20._8_4_ = (float)stack_node[0x1dc].ptr;
      auVar20._12_4_ = stack_node[0x1dc].ptr._4_4_;
      auVar42 = vblendmps_avx512vl(auVar49,auVar20);
      auVar61._0_4_ = (uint)(bVar36 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar47._0_4_
      ;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar61._4_4_ = (uint)bVar12 * auVar42._4_4_ | (uint)!bVar12 * auVar47._4_4_;
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar61._8_4_ = (uint)bVar12 * auVar42._8_4_ | (uint)!bVar12 * auVar47._8_4_;
      bVar12 = SUB81(uVar31 >> 3,0);
      auVar61._12_4_ = (uint)bVar12 * auVar42._12_4_ | (uint)!bVar12 * auVar47._12_4_;
      auVar47 = vshufps_avx(auVar61,auVar61,0xb1);
      auVar47 = vminps_avx(auVar47,auVar61);
      auVar42 = vshufpd_avx(auVar47,auVar47,1);
      auVar47 = vminps_avx(auVar42,auVar47);
      auVar52 = vinsertps_avx(auVar52,auVar47,0x1c);
      auVar42 = vblendmps_avx512vl(auVar49,stack_node._3784_16_);
      auVar62._0_4_ = (uint)(bVar36 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar47._0_4_
      ;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar62._4_4_ = (uint)bVar12 * auVar42._4_4_ | (uint)!bVar12 * auVar47._4_4_;
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar62._8_4_ = (uint)bVar12 * auVar42._8_4_ | (uint)!bVar12 * auVar47._8_4_;
      bVar12 = SUB81(uVar31 >> 3,0);
      auVar62._12_4_ = (uint)bVar12 * auVar42._12_4_ | (uint)!bVar12 * auVar47._12_4_;
      auVar47 = vshufps_avx(auVar62,auVar62,0xb1);
      auVar47 = vminps_avx(auVar47,auVar62);
      auVar42 = vshufpd_avx(auVar47,auVar47,1);
      auVar47 = vminps_avx(auVar42,auVar47);
      auVar47 = vinsertps_avx(auVar52,auVar47,0x20);
      auVar42 = vblendmps_avx512vl(auVar130,auVar21);
      auVar63._0_4_ = (uint)(bVar36 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar52._0_4_
      ;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar63._4_4_ = (uint)bVar12 * auVar42._4_4_ | (uint)!bVar12 * auVar52._4_4_;
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar63._8_4_ = (uint)bVar12 * auVar42._8_4_ | (uint)!bVar12 * auVar52._8_4_;
      bVar12 = SUB81(uVar31 >> 3,0);
      auVar63._12_4_ = (uint)bVar12 * auVar42._12_4_ | (uint)!bVar12 * auVar52._12_4_;
      auVar52 = vshufps_avx(auVar63,auVar63,0xb1);
      auVar52 = vmaxps_avx(auVar52,auVar63);
      auVar42 = vshufpd_avx(auVar52,auVar52,1);
      auVar52 = vmaxps_avx(auVar42,auVar52);
      auVar44 = vblendmps_avx512vl(auVar130,auVar20);
      auVar64._0_4_ = (uint)(bVar36 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar42._0_4_
      ;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar64._4_4_ = (uint)bVar12 * auVar44._4_4_ | (uint)!bVar12 * auVar42._4_4_;
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar64._8_4_ = (uint)bVar12 * auVar44._8_4_ | (uint)!bVar12 * auVar42._8_4_;
      bVar12 = SUB81(uVar31 >> 3,0);
      auVar64._12_4_ = (uint)bVar12 * auVar44._12_4_ | (uint)!bVar12 * auVar42._12_4_;
      auVar42 = vshufps_avx(auVar64,auVar64,0xb1);
      auVar42 = vmaxps_avx(auVar42,auVar64);
      auVar44 = vshufpd_avx(auVar42,auVar42,1);
      auVar42 = vmaxps_avx(auVar44,auVar42);
      auVar52 = vinsertps_avx(auVar52,auVar42,0x1c);
      auVar44 = vblendmps_avx512vl(auVar130,stack_node._3784_16_);
      auVar65._0_4_ = (uint)(bVar36 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar42._0_4_
      ;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar65._4_4_ = (uint)bVar12 * auVar44._4_4_ | (uint)!bVar12 * auVar42._4_4_;
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar65._8_4_ = (uint)bVar12 * auVar44._8_4_ | (uint)!bVar12 * auVar42._8_4_;
      bVar12 = SUB81(uVar31 >> 3,0);
      auVar65._12_4_ = (uint)bVar12 * auVar44._12_4_ | (uint)!bVar12 * auVar42._12_4_;
      auVar42 = vshufps_avx(auVar65,auVar65,0xb1);
      auVar42 = vmaxps_avx(auVar42,auVar65);
      auVar44 = vshufpd_avx(auVar42,auVar42,1);
      auVar42 = vmaxps_avx(auVar44,auVar42);
      auVar52 = vinsertps_avx(auVar52,auVar42,0x20);
      auVar66 = vblendmps_avx512vl(auVar52,auVar47);
      bVar12 = (bool)((byte)(uVar38 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar38 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar38 >> 3) & 1);
      bVar34 = (bool)((byte)(uVar38 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar38 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar38 >> 3) & 1);
      auVar44 = vblendmps_avx512vl(auVar130,stack_node._3752_16_);
      auVar67._0_4_ =
           (uint)(bVar36 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar36 & 1) * in_ZMM18._0_4_;
      bVar14 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar67._4_4_ = (uint)bVar14 * auVar44._4_4_ | (uint)!bVar14 * in_ZMM18._4_4_;
      bVar14 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar67._8_4_ = (uint)bVar14 * auVar44._8_4_ | (uint)!bVar14 * in_ZMM18._8_4_;
      bVar14 = SUB81(uVar31 >> 3,0);
      auVar67._12_4_ = (uint)bVar14 * auVar44._12_4_ | (uint)!bVar14 * in_ZMM18._12_4_;
      auVar44 = vshufps_avx512vl(auVar67,auVar67,0xb1);
      auVar68 = vmaxps_avx512vl(auVar44,auVar67);
      auVar51 = vshufpd_avx(auVar68,auVar68,1);
      auVar44 = vblendmps_avx512vl(auVar49,stack_node._3768_16_);
      auVar69._0_4_ =
           (uint)(bVar36 & 1) * auVar44._0_4_ |
           (uint)!(bool)(bVar36 & 1) * (int)(float)stack_node[0x1db].ptr;
      bVar14 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar69._4_4_ =
           (uint)bVar14 * auVar44._4_4_ | (uint)!bVar14 * (int)stack_node[0x1db].ptr._4_4_;
      bVar14 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar69._8_4_ =
           (uint)bVar14 * auVar44._8_4_ | (uint)!bVar14 * (int)(float)stack_node[0x1dc].ptr;
      bVar14 = SUB81(uVar31 >> 3,0);
      auVar69._12_4_ =
           (uint)bVar14 * auVar44._12_4_ | (uint)!bVar14 * (int)stack_node[0x1dc].ptr._4_4_;
      auVar44 = vshufps_avx(auVar69,auVar69,0xb1);
      auVar44 = vminps_avx(auVar44,auVar69);
      auVar49 = vshufpd_avx(auVar44,auVar44,1);
      auVar49 = vminps_avx(auVar49,auVar44);
      auVar44 = vmaxss_avx(auVar51,auVar68);
      auVar70._0_4_ =
           (float)((uint)(bVar35 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar48._0_4_);
      bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
      auVar70._4_4_ = (float)((uint)bVar14 * auVar46._4_4_ | (uint)!bVar14 * auVar48._4_4_);
      bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
      auVar70._8_4_ = (float)((uint)bVar14 * auVar46._8_4_ | (uint)!bVar14 * auVar48._8_4_);
      bVar14 = (bool)((byte)(uVar38 >> 3) & 1);
      auVar70._12_4_ = (float)((uint)bVar14 * auVar46._12_4_ | (uint)!bVar14 * auVar48._12_4_);
      fVar100 = (float)((uint)(bVar35 & 1) * auVar52._0_4_ |
                       (uint)!(bool)(bVar35 & 1) * auVar47._0_4_) * fVar1;
      fVar107 = (float)((uint)(bVar35 & 1) * auVar66._0_4_ |
                       (uint)!(bool)(bVar35 & 1) * auVar42._0_4_) * auVar70._0_4_;
      uVar38 = (ulong)(fVar1 < 0.0) << 5;
      stack_node[0x1c6].ptr = uVar38;
      stack_node[0x227].ptr = *(size_t *)(stack_node[0x1c0].ptr + 0x70);
      stack_node[0x228].ptr._0_4_ = 0;
      uVar122 = fVar1;
      uVar118 = fVar1;
      uVar119 = CONCAT44(uVar122,uVar118);
      uVar123 = fVar1;
      auVar154._8_4_ = uVar123;
      auVar154._0_8_ = uVar119;
      uVar124 = fVar1;
      auVar154._12_4_ = uVar124;
      uVar125 = fVar1;
      auVar120._16_4_ = uVar125;
      auVar120._0_16_ = auVar154;
      uVar126 = fVar1;
      auVar120._20_4_ = uVar126;
      auVar120._24_4_ = fVar1;
      auVar120._28_4_ = fVar1;
      auVar140 = ZEXT3264(auVar120);
      auVar72._4_4_ = fVar100;
      auVar72._0_4_ = fVar100;
      auVar72._8_4_ = fVar100;
      auVar72._12_4_ = fVar100;
      auVar72._16_4_ = fVar100;
      auVar72._20_4_ = fVar100;
      auVar72._24_4_ = fVar100;
      auVar72._28_4_ = fVar100;
      auVar117._8_4_ = 0x80000000;
      auVar117._0_8_ = 0x8000000080000000;
      auVar117._12_4_ = 0x80000000;
      auVar117._16_4_ = 0x80000000;
      auVar117._20_4_ = 0x80000000;
      auVar117._24_4_ = 0x80000000;
      auVar117._28_4_ = 0x80000000;
      auVar72 = vxorps_avx512vl(auVar72,auVar117);
      auVar92 = ZEXT3264(auVar72);
      auVar73 = vbroadcastsd_avx512vl(auVar50);
      auVar142 = ZEXT3264(auVar73);
      auVar80._8_4_ = 1;
      auVar80._0_8_ = 0x100000001;
      auVar80._12_4_ = 1;
      auVar80._16_4_ = 1;
      auVar80._20_4_ = 1;
      auVar80._24_4_ = 1;
      auVar80._28_4_ = 1;
      auVar76 = ZEXT1632(CONCAT412((float)((uint)bVar17 * auVar52._12_4_ |
                                          (uint)!bVar17 * auVar47._12_4_) * fVar4,
                                   CONCAT48((float)((uint)bVar13 * auVar52._8_4_ |
                                                   (uint)!bVar13 * auVar47._8_4_) * fVar3,
                                            CONCAT44((float)((uint)bVar34 * auVar52._4_4_ |
                                                            (uint)!bVar34 * auVar47._4_4_) * fVar2,
                                                     fVar100))));
      auVar82 = vpermps_avx2(auVar80,auVar76);
      auVar74 = vxorps_avx512vl(auVar82,auVar117);
      auVar143 = ZEXT3264(auVar74);
      auVar83._8_4_ = 2;
      auVar83._0_8_ = 0x200000002;
      auVar83._12_4_ = 2;
      auVar83._16_4_ = 2;
      auVar83._20_4_ = 2;
      auVar83._24_4_ = 2;
      auVar83._28_4_ = 2;
      auVar75 = vpermps_avx512vl(auVar83,ZEXT1632(auVar59));
      auVar144 = ZEXT3264(auVar75);
      auVar82 = vpermps_avx2(auVar83,auVar76);
      auVar76 = vxorps_avx512vl(auVar82,auVar117);
      auVar145 = ZEXT3264(auVar76);
      auVar77 = vbroadcastss_avx512vl(auVar70);
      auVar146 = ZEXT3264(auVar77);
      auVar82._4_4_ = fVar107;
      auVar82._0_4_ = fVar107;
      auVar82._8_4_ = fVar107;
      auVar82._12_4_ = fVar107;
      auVar82._16_4_ = fVar107;
      auVar82._20_4_ = fVar107;
      auVar82._24_4_ = fVar107;
      auVar82._28_4_ = fVar107;
      auVar78 = vxorps_avx512vl(auVar82,auVar117);
      auVar147 = ZEXT3264(auVar78);
      auVar79 = vpermps_avx512vl(auVar80,ZEXT1632(auVar70));
      auVar148 = ZEXT3264(auVar79);
      auVar112 = ZEXT1632(CONCAT412((float)((uint)bVar16 * auVar66._12_4_ |
                                           (uint)!bVar16 * auVar42._12_4_) * auVar70._12_4_,
                                    CONCAT48((float)((uint)bVar15 * auVar66._8_4_ |
                                                    (uint)!bVar15 * auVar42._8_4_) * auVar70._8_4_,
                                             CONCAT44((float)((uint)bVar12 * auVar66._4_4_ |
                                                             (uint)!bVar12 * auVar42._4_4_) *
                                                      auVar70._4_4_,fVar107))));
      auVar82 = vpermps_avx2(auVar80,auVar112);
      auVar80 = vxorps_avx512vl(auVar82,auVar117);
      auVar149 = ZEXT3264(auVar80);
      auVar81 = vpermps_avx512vl(auVar83,ZEXT1632(auVar70));
      auVar150 = ZEXT3264(auVar81);
      auVar82 = vpermps_avx2(auVar83,auVar112);
      auVar82 = vxorps_avx512vl(auVar82,auVar117);
      auVar151 = ZEXT3264(auVar82);
      auVar83 = vbroadcastss_avx512vl(auVar49);
      auVar152 = ZEXT3264(auVar83);
      auVar89._8_4_ = 0x7f800000;
      auVar89._0_8_ = 0x7f8000007f800000;
      auVar89._12_4_ = 0x7f800000;
      auVar48 = vpblendmd_avx512vl(auVar89,stack_node._3768_16_);
      uVar40 = (uint)(bVar36 & 1) * auVar48._0_4_ |
               (uint)!(bool)(bVar36 & 1) * (int)stack_node[0x1d7].ptr;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      uVar84 = (uint)bVar12 * auVar48._4_4_ | (uint)!bVar12 * stack_node[0x1d7].ptr._4_4_;
      auVar71._0_8_ = CONCAT44(uVar84,uVar40);
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar71._8_4_ = (uint)bVar12 * auVar48._8_4_ | (uint)!bVar12 * (int)stack_node[0x1d8].ptr;
      bVar12 = SUB81(uVar31 >> 3,0);
      auVar71._12_4_ = (uint)bVar12 * auVar48._12_4_ | (uint)!bVar12 * stack_node[0x1d8].ptr._4_4_;
      auVar141 = ZEXT1664(auVar71);
      pNVar32 = stack_node + 0x229;
      stack_node[0x21f].ptr = uVar119;
      stack_node[0x220].ptr = auVar154._8_8_;
      stack_node[0x221].ptr = auVar120._16_8_;
      stack_node[0x222].ptr = auVar120._24_8_;
      stack_node[0x21b].ptr = auVar72._0_8_;
      stack_node[0x21c].ptr = auVar72._8_8_;
      stack_node[0x21d].ptr = auVar72._16_8_;
      stack_node[0x21e].ptr = auVar72._24_8_;
      stack_node[0x217].ptr = auVar73._0_8_;
      stack_node[0x218].ptr = auVar73._8_8_;
      stack_node[0x219].ptr = auVar73._16_8_;
      stack_node[0x21a].ptr = auVar73._24_8_;
      stack_node[0x213].ptr = auVar74._0_8_;
      stack_node[0x214].ptr = auVar74._8_8_;
      stack_node[0x215].ptr = auVar74._16_8_;
      stack_node[0x216].ptr = auVar74._24_8_;
      stack_node[0x20f].ptr = auVar75._0_8_;
      stack_node[0x210].ptr = auVar75._8_8_;
      stack_node[0x211].ptr = auVar75._16_8_;
      stack_node[0x212].ptr = auVar75._24_8_;
      stack_node[0x20b].ptr = auVar76._0_8_;
      stack_node[0x20c].ptr = auVar76._8_8_;
      stack_node[0x20d].ptr = auVar76._16_8_;
      stack_node[0x20e].ptr = auVar76._24_8_;
      stack_node[0x207].ptr = auVar77._0_8_;
      stack_node[0x208].ptr = auVar77._8_8_;
      stack_node[0x209].ptr = auVar77._16_8_;
      stack_node[0x20a].ptr = auVar77._24_8_;
      stack_node[0x203].ptr = auVar78._0_8_;
      stack_node[0x204].ptr = auVar78._8_8_;
      stack_node[0x205].ptr = auVar78._16_8_;
      stack_node[0x206].ptr = auVar78._24_8_;
      stack_node[0x1ff].ptr = auVar79._0_8_;
      stack_node[0x200].ptr = auVar79._8_8_;
      stack_node[0x201].ptr = auVar79._16_8_;
      stack_node[0x202].ptr = auVar79._24_8_;
      stack_node[0x1fb].ptr = auVar80._0_8_;
      stack_node[0x1fc].ptr = auVar80._8_8_;
      stack_node[0x1fd].ptr = auVar80._16_8_;
      stack_node[0x1fe].ptr = auVar80._24_8_;
      stack_node[0x1f7].ptr = auVar81._0_8_;
      stack_node[0x1f8].ptr = auVar81._8_8_;
      stack_node[0x1f9].ptr = auVar81._16_8_;
      stack_node[0x1fa].ptr = auVar81._24_8_;
      stack_node[499].ptr = auVar82._0_8_;
      stack_node[500].ptr = auVar82._8_8_;
      stack_node[0x1f5].ptr = auVar82._16_8_;
      stack_node[0x1f6].ptr = auVar82._24_8_;
      stack_node[0x1ef].ptr = auVar83._0_8_;
      stack_node[0x1f0].ptr = auVar83._8_8_;
      stack_node[0x1f1].ptr = auVar83._16_8_;
      stack_node[0x1f2].ptr = auVar83._24_8_;
      stack_node[0x1eb].ptr = auVar71._0_8_;
      stack_node[0x1ec].ptr = auVar71._8_8_;
      do {
        in_ZMM18 = ZEXT1664(auVar67);
        auVar82 = vbroadcastss_avx512vl(auVar44);
        auVar153 = ZEXT3264(auVar82);
LAB_00861dfa:
        do {
          do {
            if (pNVar32 == stack_node + 0x227) {
              if (stack_node[0x1c1].ptr == 0) {
                return;
              }
              goto LAB_00861a64;
            }
            uVar8 = (undefined4)pNVar32[-1].ptr;
            auVar90._4_4_ = uVar8;
            auVar90._0_4_ = uVar8;
            auVar90._8_4_ = uVar8;
            auVar90._12_4_ = uVar8;
            auVar93 = ZEXT1664(auVar90);
            pNVar32 = pNVar32 + -2;
            auVar48 = in_ZMM18._0_16_;
            uVar18 = vcmpps_avx512vl(auVar90,auVar48,1);
          } while ((char)uVar18 == '\0');
          sVar27 = pNVar32->ptr;
          while( true ) {
            auVar82 = auVar153._0_32_;
            if ((sVar27 & 8) != 0) break;
            auVar72 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(sVar27 + 0x40 + stack_node[0x1c6].ptr),
                                 auVar92._0_32_,auVar140._0_32_);
            auVar73 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(sVar27 + 0x40 + stack_node[0x1c8].ptr),
                                 auVar143._0_32_,auVar142._0_32_);
            auVar72 = vpmaxsd_avx2(auVar72,auVar73);
            auVar73 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(sVar27 + 0x40 + uVar39),auVar145._0_32_,
                                 auVar144._0_32_);
            auVar73 = vpmaxsd_avx512vl(auVar73,auVar152._0_32_);
            auVar72 = vpmaxsd_avx2(auVar72,auVar73);
            auVar73 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(sVar27 + 0x40 + (uVar38 ^ 0x20)),
                                 auVar147._0_32_,auVar146._0_32_);
            auVar74 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(sVar27 + 0x40 + stack_node[0x1c7].ptr),
                                 auVar149._0_32_,auVar148._0_32_);
            auVar73 = vpminsd_avx2(auVar73,auVar74);
            auVar74 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(sVar27 + 0x40 + (uVar39 ^ 0x20)),
                                 auVar151._0_32_,auVar150._0_32_);
            auVar82 = vpminsd_avx512vl(auVar74,auVar82);
            auVar82 = vpminsd_avx2(auVar73,auVar82);
            stack_node[0x1cb].ptr = auVar72._0_8_;
            stack_node[0x1cc].ptr = auVar72._8_8_;
            stack_node[0x1cd].ptr = auVar72._16_8_;
            stack_node[0x1ce].ptr = auVar72._24_8_;
            uVar31 = vcmpps_avx512vl(auVar72,auVar82,2);
            if ((char)uVar31 == '\0') {
              bVar12 = false;
              sVar24 = sVar27;
            }
            else {
              auVar93 = ZEXT1664(auVar138._0_16_);
              uVar30 = 0;
              sVar23 = 8;
              do {
                lVar26 = 0;
                for (uVar19 = uVar31; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000)
                {
                  lVar26 = lVar26 + 1;
                }
                uVar8 = *(undefined4 *)(sVar27 + 0x40 + lVar26 * 4);
                auVar95._4_4_ = uVar8;
                auVar95._0_4_ = uVar8;
                auVar95._8_4_ = uVar8;
                auVar95._12_4_ = uVar8;
                auVar47 = vfmadd132ps_fma(auVar95,auVar129._0_16_,auVar127._0_16_);
                uVar8 = *(undefined4 *)(sVar27 + 0x80 + lVar26 * 4);
                auVar99._4_4_ = uVar8;
                auVar99._0_4_ = uVar8;
                auVar99._8_4_ = uVar8;
                auVar99._12_4_ = uVar8;
                auVar42 = vfmadd132ps_fma(auVar99,auVar131._0_16_,auVar121._0_16_);
                uVar8 = *(undefined4 *)(sVar27 + 0xc0 + lVar26 * 4);
                auVar102._4_4_ = uVar8;
                auVar102._0_4_ = uVar8;
                auVar102._8_4_ = uVar8;
                auVar102._12_4_ = uVar8;
                auVar50 = vfmadd132ps_avx512vl(auVar102,auVar134._0_16_,auVar128._0_16_);
                uVar8 = *(undefined4 *)(sVar27 + 0x60 + lVar26 * 4);
                auVar106._4_4_ = uVar8;
                auVar106._0_4_ = uVar8;
                auVar106._8_4_ = uVar8;
                auVar106._12_4_ = uVar8;
                auVar44 = vfmadd132ps_fma(auVar106,auVar129._0_16_,auVar127._0_16_);
                uVar8 = *(undefined4 *)(sVar27 + 0xa0 + lVar26 * 4);
                auVar111._4_4_ = uVar8;
                auVar111._0_4_ = uVar8;
                auVar111._8_4_ = uVar8;
                auVar111._12_4_ = uVar8;
                auVar49 = vfmadd132ps_fma(auVar111,auVar131._0_16_,auVar121._0_16_);
                uVar8 = *(undefined4 *)(sVar27 + 0xe0 + lVar26 * 4);
                auVar115._4_4_ = uVar8;
                auVar115._0_4_ = uVar8;
                auVar115._8_4_ = uVar8;
                auVar115._12_4_ = uVar8;
                auVar51 = vfmadd132ps_avx512vl(auVar115,auVar134._0_16_,auVar128._0_16_);
                auVar46 = vpminsd_avx(auVar47,auVar44);
                auVar52 = vpminsd_avx(auVar42,auVar49);
                auVar46 = vpmaxsd_avx(auVar46,auVar52);
                auVar52 = vpminsd_avx(auVar50,auVar51);
                auVar52 = vpmaxsd_avx(auVar52,auVar141._0_16_);
                auVar46 = vpmaxsd_avx(auVar46,auVar52);
                auVar52 = vpmaxsd_avx(auVar47,auVar44);
                auVar47 = vpmaxsd_avx(auVar42,auVar49);
                auVar47 = vpminsd_avx(auVar52,auVar47);
                auVar52 = vpmaxsd_avx(auVar50,auVar51);
                auVar52 = vpminsd_avx512vl(auVar52,auVar48);
                auVar52 = vpminsd_avx(auVar47,auVar52);
                uVar19 = vpcmpd_avx512vl(auVar46,auVar52,2);
                sVar24 = sVar23;
                if ((uVar19 & 0xf) != 0) {
                  uVar8 = *(undefined4 *)((long)&stack_node[0x1cb].ptr + lVar26 * 4);
                  auVar96._4_4_ = uVar8;
                  auVar96._0_4_ = uVar8;
                  auVar96._8_4_ = uVar8;
                  auVar96._12_4_ = uVar8;
                  sVar24 = *(size_t *)(sVar27 + lVar26 * 8);
                  auVar46 = auVar93._0_16_;
                  uVar18 = vcmpps_avx512vl(auVar96,auVar46,1);
                  if ((char)uVar18 == '\0') {
                    pNVar32->ptr = sVar24;
                    sVar24 = sVar23;
                  }
                  else {
                    if (sVar23 == 8) {
                      auVar93 = ZEXT1664(auVar96);
                      goto LAB_00861fd5;
                    }
                    pNVar32->ptr = sVar23;
                    auVar93 = ZEXT1664(auVar96);
                    auVar96 = auVar46;
                  }
                  uVar30 = uVar30 + 1;
                  *(int *)&pNVar32[1].ptr = auVar96._0_4_;
                  pNVar32 = pNVar32 + 2;
                }
LAB_00861fd5:
                uVar31 = uVar31 - 1 & uVar31;
                sVar23 = sVar24;
              } while (uVar31 != 0);
              if (sVar24 == 8) {
                bVar12 = false;
              }
              else {
                bVar12 = true;
                if (1 < uVar30) {
                  pNVar5 = pNVar32 + -4;
                  pNVar6 = pNVar32 + -2;
                  if ((uint)pNVar32[-3].ptr < (uint)pNVar32[-1].ptr) {
                    sVar27 = pNVar5->ptr;
                    sVar23 = pNVar32[-3].ptr;
                    stack_node._3560_16_ = *(undefined1 (*) [16])pNVar5;
                    *(int *)&pNVar32[-3].ptr = (int)pNVar32[-1].ptr;
                    pNVar5->ptr = pNVar6->ptr;
                    pNVar6->ptr = sVar27;
                    stack_node[0x1be].ptr._0_4_ = (undefined4)sVar23;
                    *(undefined4 *)&pNVar32[-1].ptr = (undefined4)stack_node[0x1be].ptr;
                  }
                  stack_node[0x1ba].ptr = 8;
                  if (uVar30 != 2) {
                    pNVar7 = pNVar32 + -6;
                    if ((uint)pNVar32[-5].ptr < (uint)pNVar32[-1].ptr) {
                      sVar27 = pNVar7->ptr;
                      sVar23 = pNVar32[-5].ptr;
                      stack_node._3560_16_ = *(undefined1 (*) [16])pNVar7;
                      *(int *)&pNVar32[-5].ptr = (int)pNVar32[-1].ptr;
                      pNVar7->ptr = pNVar6->ptr;
                      pNVar6->ptr = sVar27;
                      stack_node[0x1be].ptr._0_4_ = (undefined4)sVar23;
                      *(undefined4 *)&pNVar32[-1].ptr = (undefined4)stack_node[0x1be].ptr;
                    }
                    stack_node[0x1ba].ptr = 8;
                    if ((uint)pNVar32[-5].ptr < (uint)pNVar32[-3].ptr) {
                      sVar27 = pNVar7->ptr;
                      sVar23 = pNVar32[-5].ptr;
                      stack_node._3560_16_ = *(undefined1 (*) [16])pNVar7;
                      *(int *)&pNVar32[-5].ptr = (int)pNVar32[-3].ptr;
                      pNVar7->ptr = pNVar5->ptr;
                      pNVar5->ptr = sVar27;
                      stack_node[0x1be].ptr._0_4_ = (undefined4)sVar23;
                      *(undefined4 *)&pNVar32[-3].ptr = (undefined4)stack_node[0x1be].ptr;
                    }
                  }
                }
              }
            }
            sVar27 = sVar24;
            if (!bVar12) goto LAB_00861dfa;
          }
          uVar31 = vcmpps_avx512vl(auVar48,auVar93._0_16_,6);
          if ((char)uVar31 == '\0') goto LAB_00861dfa;
          stack_node[0x1c4].ptr = (ulong)((uint)sVar27 & 0xf) - 8;
          if (stack_node[0x1c4].ptr != 0) {
            stack_node[0x1c5].ptr = 0;
            stack_node[0x1ed].ptr = auVar48._0_8_;
            stack_node[0x1ee].ptr = auVar48._8_8_;
            stack_node[0x223].ptr = auVar82._0_8_;
            stack_node[0x224].ptr = auVar82._8_8_;
            stack_node[0x225].ptr = auVar82._16_8_;
            stack_node[0x226].ptr = auVar82._24_8_;
            stack_node[0x1bc].ptr._6_2_ = (ushort)uVar31;
            do {
              stack_node[0x1d0].ptr._4_4_ =
                   *(uint *)((sVar27 & 0xfffffffffffffff0) + stack_node[0x1c5].ptr * 8);
              stack_node[0x1d1].ptr =
                   (size_t)(context->scene->geometries).items[stack_node[0x1d0].ptr._4_4_].ptr;
              uVar9 = ((Geometry *)stack_node[0x1d1].ptr)->mask;
              auVar91._4_4_ = uVar9;
              auVar91._0_4_ = uVar9;
              auVar91._8_4_ = uVar9;
              auVar91._12_4_ = uVar9;
              uVar18 = vptestmd_avx512vl(auVar91,*(undefined1 (*) [16])(ray + 0x90));
              bVar35 = (byte)uVar18 & 0xf & (byte)uVar31;
              if (bVar35 != 0) {
                stack_node._3560_16_ = vpmovm2d_avx512vl((ulong)bVar35);
                stack_node[0x1cc].ptr = (size_t)((Geometry *)stack_node[0x1d1].ptr)->userPtr;
                stack_node[0x1cb].ptr = (size_t)(stack_node + 0x1bd);
                auVar48 = stack_node._3672_16_;
                stack_node[0x1ce].ptr = (size_t)context->user;
                stack_node[0x1d0].ptr._0_4_ = 4;
                stack_node[0x1cd].ptr._0_4_ =
                     *(undefined4 *)((sVar27 & 0xfffffffffffffff0) + 4 + stack_node[0x1c5].ptr * 8);
                stack_node._3672_20_ = CONCAT416((undefined4)stack_node[0x1cd].ptr,auVar48);
                stack_node[0x1d2].ptr = 0;
                stack_node[0x1d3].ptr = (size_t)context->args;
                pp_Var25 = (_func_int **)((RTCIntersectArguments *)stack_node[0x1d3].ptr)->intersect
                ;
                if (pp_Var25 == (_func_int **)0x0) {
                  pp_Var25 = (((Geometry *)(stack_node[0x1d1].ptr + 0x60))->super_RefCount).
                             _vptr_RefCount;
                }
                stack_node[0x1ba].ptr = 0x8621dc;
                stack_node[0x1cf].ptr = (size_t)ray;
                (*(code *)pp_Var25)((RTCIntersectFunctionNArguments *)(stack_node + 0x1cb));
                auVar121 = ZEXT1664(stack_node._3912_16_);
                auVar127 = ZEXT1664(stack_node._3896_16_);
                auVar128 = ZEXT1664(stack_node._3880_16_);
                auVar129 = ZEXT1664(stack_node._3864_16_);
                auVar131 = ZEXT1664(stack_node._3848_16_);
                auVar134 = ZEXT1664(stack_node._3832_16_);
                auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar138 = ZEXT1664(auVar48);
                stack_node[0x1ba].ptr = 8;
                in_ZMM18 = ZEXT1664(stack_node._3944_16_);
                auVar140 = ZEXT3264(stack_node._4344_32_);
                auVar92 = ZEXT3264(stack_node._4312_32_);
                auVar142 = ZEXT3264(stack_node._4280_32_);
                auVar143 = ZEXT3264(stack_node._4248_32_);
                auVar144 = ZEXT3264(stack_node._4216_32_);
                auVar145 = ZEXT3264(stack_node._4184_32_);
                auVar146 = ZEXT3264(stack_node._4152_32_);
                auVar147 = ZEXT3264(stack_node._4120_32_);
                auVar148 = ZEXT3264(stack_node._4088_32_);
                auVar149 = ZEXT3264(stack_node._4056_32_);
                auVar150 = ZEXT3264(stack_node._4024_32_);
                auVar151 = ZEXT3264(stack_node._3992_32_);
                auVar152 = ZEXT3264(stack_node._3960_32_);
                auVar141 = ZEXT1664(stack_node._3928_16_);
                auVar153 = ZEXT3264(stack_node._4376_32_);
                uVar31 = (ulong)stack_node[0x1bc].ptr._6_2_;
                context = (RayQueryContext *)stack_node[0x1c3];
                ray = (RayHitK<4> *)stack_node[0x1c2];
              }
              stack_node[0x1c5].ptr = stack_node[0x1c5].ptr + 1;
            } while (stack_node[0x1c4].ptr != stack_node[0x1c5].ptr);
          }
          auVar48 = *(undefined1 (*) [16])(ray + 0x80);
          uVar18 = vcmpps_avx512vl(auVar48,in_ZMM18._0_16_,1);
        } while ((byte)((byte)uVar18 & (byte)uVar31) == 0);
        bVar12 = (bool)((byte)uVar31 & 1);
        auVar67._0_4_ = (uint)bVar12 * auVar48._0_4_ | (uint)!bVar12 * in_ZMM18._0_4_;
        bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
        auVar67._4_4_ = (uint)bVar12 * auVar48._4_4_ | (uint)!bVar12 * in_ZMM18._4_4_;
        bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
        auVar67._8_4_ = (uint)bVar12 * auVar48._8_4_ | (uint)!bVar12 * in_ZMM18._8_4_;
        bVar12 = (bool)((byte)(uVar31 >> 3) & 1);
        auVar67._12_4_ = (uint)bVar12 * auVar48._12_4_ | (uint)!bVar12 * in_ZMM18._12_4_;
        auVar48 = vshufps_avx512vl(auVar67,auVar67,0xb1);
        auVar46 = vmaxps_avx512vl(auVar48,auVar67);
        auVar48 = vshufpd_avx(auVar46,auVar46,1);
        auVar44 = vmaxss_avx(auVar48,auVar46);
      } while( true );
    }
    auVar48 = vpcmpeqd_avx(auVar48,auVar48);
    uVar38 = vpcmpeqd_avx512vl(auVar48,(undefined1  [16])valid_i->field_0);
    uVar38 = uVar38 & 0xf;
    bVar35 = (byte)uVar38;
    if (bVar35 != 0) {
      auVar48 = *(undefined1 (*) [16])(ray + 0x40);
      auVar46 = *(undefined1 (*) [16])(ray + 0x50);
      auVar52 = *(undefined1 (*) [16])(ray + 0x60);
      auVar97._8_4_ = 0x7fffffff;
      auVar97._0_8_ = 0x7fffffff7fffffff;
      auVar97._12_4_ = 0x7fffffff;
      auVar47 = vandps_avx(auVar52,auVar97);
      auVar103._8_4_ = 0x219392ef;
      auVar103._0_8_ = 0x219392ef219392ef;
      auVar103._12_4_ = 0x219392ef;
      uVar31 = vcmpps_avx512vl(auVar47,auVar103,1);
      bVar12 = (bool)((byte)uVar31 & 1);
      auVar41._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar52._0_4_;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar41._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar52._4_4_;
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar41._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar52._8_4_;
      bVar12 = (bool)((byte)(uVar31 >> 3) & 1);
      auVar41._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar52._12_4_;
      auVar42 = vrcp14ps_avx512vl(auVar41);
      auVar113._8_4_ = 0x3f800000;
      auVar113._0_8_ = &DAT_3f8000003f800000;
      auVar113._12_4_ = 0x3f800000;
      auVar47 = vfnmadd213ps_fma(auVar41,auVar42,auVar113);
      auVar52 = vandps_avx(auVar46,auVar97);
      uVar31 = vcmpps_avx512vl(auVar52,auVar103,1);
      bVar12 = (bool)((byte)uVar31 & 1);
      auVar43._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar46._0_4_;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar43._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar46._4_4_;
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar43._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar46._8_4_;
      bVar12 = (bool)((byte)(uVar31 >> 3) & 1);
      auVar43._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar46._12_4_;
      auVar44 = vrcp14ps_avx512vl(auVar43);
      auVar52 = vfnmadd213ps_fma(auVar43,auVar44,auVar113);
      auVar46 = vandps_avx(auVar48,auVar97);
      uVar31 = vcmpps_avx512vl(auVar46,auVar103,1);
      bVar12 = (bool)((byte)uVar31 & 1);
      auVar45._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar48._0_4_;
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar45._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar48._4_4_;
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar45._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar48._8_4_;
      bVar12 = (bool)((byte)(uVar31 >> 3) & 1);
      auVar45._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar48._12_4_;
      auVar46 = vrcp14ps_avx512vl(auVar45);
      auVar48 = vfnmadd213ps_fma(auVar45,auVar46,auVar113);
      auVar48 = vfmadd132ps_fma(auVar48,auVar46,auVar46);
      auVar121 = ZEXT1664(auVar48);
      auVar46 = vfmadd132ps_fma(auVar52,auVar44,auVar44);
      auVar127 = ZEXT1664(auVar46);
      auVar52 = vfmadd132ps_fma(auVar47,auVar42,auVar42);
      auVar128 = ZEXT1664(auVar52);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar129 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar47 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      stack_near[1].field_0._0_4_ =
           (uint)(bVar35 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar35 & 1) * 0x7f800000;
      bVar12 = (bool)((byte)(uVar38 >> 1) & 1);
      stack_near[1].field_0._4_4_ = (uint)bVar12 * auVar47._4_4_ | (uint)!bVar12 * 0x7f800000;
      bVar12 = (bool)((byte)(uVar38 >> 2) & 1);
      stack_near[1].field_0._8_4_ = (uint)bVar12 * auVar47._8_4_ | (uint)!bVar12 * 0x7f800000;
      bVar12 = SUB81(uVar38 >> 3,0);
      stack_near[1].field_0._12_4_ = (uint)bVar12 * auVar47._12_4_ | (uint)!bVar12 * 0x7f800000;
      auVar131 = ZEXT1664((undefined1  [16])stack_near[1].field_0);
      auVar47 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40);
      bVar12 = (bool)((byte)(uVar38 >> 1) & 1);
      bVar34 = (bool)((byte)(uVar38 >> 2) & 1);
      bVar14 = SUB81(uVar38 >> 3,0);
      auVar134 = ZEXT1664(CONCAT412((uint)bVar14 * auVar47._12_4_ | (uint)!bVar14 * -0x800000,
                                    CONCAT48((uint)bVar34 * auVar47._8_4_ |
                                             (uint)!bVar34 * -0x800000,
                                             CONCAT44((uint)bVar12 * auVar47._4_4_ |
                                                      (uint)!bVar12 * -0x800000,
                                                      (uint)(bVar35 & 1) * auVar47._0_4_ |
                                                      (uint)!(bool)(bVar35 & 1) * -0x800000))));
      pNVar32 = stack_node + 2;
      paVar33 = &stack_near[2].field_0;
      auVar138 = ZEXT1664(CONCAT412(auVar48._12_4_ * -*(float *)(ray + 0xc),
                                    CONCAT48(auVar48._8_4_ * -*(float *)(ray + 8),
                                             CONCAT44(auVar48._4_4_ * -*(float *)(ray + 4),
                                                      auVar48._0_4_ * -*(float *)ray))));
      auVar48 = *(undefined1 (*) [16])(ray + 0x10);
      auVar94._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
      auVar94._8_4_ = auVar48._8_4_ ^ 0x80000000;
      auVar94._12_4_ = auVar48._12_4_ ^ 0x80000000;
      auVar48 = *(undefined1 (*) [16])(ray + 0x20);
      auVar85._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
      auVar85._8_4_ = auVar48._8_4_ ^ 0x80000000;
      auVar85._12_4_ = auVar48._12_4_ ^ 0x80000000;
      auVar48 = vmulps_avx512vl(auVar46,auVar94);
      auVar140 = ZEXT1664(auVar48);
      auVar48 = vmulps_avx512vl(auVar52,auVar85);
      auVar141 = ZEXT1664(auVar48);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      do {
        auVar48 = auVar134._0_16_;
        paVar33 = paVar33 + -1;
        pNVar5 = pNVar32 + -1;
        pNVar32 = pNVar32 + -1;
        bVar12 = true;
        if (pNVar5->ptr != 0xfffffffffffffff8) {
          auVar92 = ZEXT1664((undefined1  [16])*paVar33);
          uVar18 = vcmpps_avx512vl((undefined1  [16])*paVar33,auVar48,1);
          sVar27 = pNVar5->ptr;
          if ((char)uVar18 != '\0') {
            do {
              local_34f8 = auVar121._0_16_;
              local_3548 = auVar138._0_16_;
              local_3508 = auVar127._0_16_;
              local_3558 = auVar140._0_16_;
              local_3518 = auVar128._0_16_;
              local_3568 = auVar141._0_16_;
              local_3528 = auVar131._0_16_;
              if ((sVar27 & 8) != 0) {
                if (sVar27 == 0xfffffffffffffff8) goto LAB_00824f32;
                uVar18 = vcmpps_avx512vl(auVar48,auVar92._0_16_,6);
                uVar37 = (ushort)uVar18;
                bVar35 = (byte)uVar18;
                if (bVar35 != 0) {
                  uVar38 = (ulong)((uint)sVar27 & 0xf);
                  if (uVar38 != 8) {
                    lVar26 = 0;
                    local_3538 = auVar48;
                    do {
                      local_35b0.geomID = *(uint *)((sVar27 & 0xfffffffffffffff0) + lVar26 * 8);
                      local_3580 = (context->scene->geometries).items[local_35b0.geomID].ptr;
                      uVar9 = local_3580->mask;
                      auVar87._4_4_ = uVar9;
                      auVar87._0_4_ = uVar9;
                      auVar87._8_4_ = uVar9;
                      auVar87._12_4_ = uVar9;
                      uVar18 = vptestmd_avx512vl(auVar87,*(undefined1 (*) [16])(ray + 0x90));
                      bVar36 = (byte)uVar18 & 0xf & bVar35;
                      if (bVar36 != 0) {
                        local_35b0.primID =
                             *(uint *)((sVar27 & 0xfffffffffffffff0) + 4 + lVar26 * 8);
                        mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                       vpmovm2d_avx512vl((ulong)bVar36);
                        local_35b0.valid = (int *)&mask;
                        local_35b0.geometryUserPtr = local_3580->userPtr;
                        local_35b0.context = context->user;
                        local_35b0.N = 4;
                        local_3578 = 0;
                        local_3570 = context->args;
                        pp_Var25 = (_func_int **)local_3570->intersect;
                        if (pp_Var25 == (_func_int **)0x0) {
                          pp_Var25 = local_3580[1].super_RefCount._vptr_RefCount;
                        }
                        local_35b0.rayhit = (RTCRayHitN *)ray;
                        (*(code *)pp_Var25)(&local_35b0);
                        auVar121 = ZEXT1664(local_34f8);
                        auVar127 = ZEXT1664(local_3508);
                        auVar128 = ZEXT1664(local_3518);
                        auVar129 = ZEXT1664(CONCAT412(0x7f800000,
                                                      CONCAT48(0x7f800000,0x7f8000007f800000)));
                        auVar131 = ZEXT1664(local_3528);
                        auVar134 = ZEXT1664(local_3538);
                        auVar138 = ZEXT1664(local_3548);
                        auVar140 = ZEXT1664(local_3558);
                        auVar141 = ZEXT1664(local_3568);
                      }
                      auVar48 = auVar134._0_16_;
                      lVar26 = lVar26 + 1;
                    } while (uVar38 - 8 != lVar26);
                  }
                  bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
                  bVar34 = (bool)((byte)(uVar37 >> 2) & 1);
                  bVar14 = (bool)((byte)(uVar37 >> 3) & 1);
                  auVar134 = ZEXT1664(CONCAT412((uint)bVar14 * *(int *)(ray + 0x8c) |
                                                (uint)!bVar14 * auVar48._12_4_,
                                                CONCAT48((uint)bVar34 * *(int *)(ray + 0x88) |
                                                         (uint)!bVar34 * auVar48._8_4_,
                                                         CONCAT44((uint)bVar12 *
                                                                  *(int *)(ray + 0x84) |
                                                                  (uint)!bVar12 * auVar48._4_4_,
                                                                  (uint)(bVar35 & 1) *
                                                                  *(int *)(ray + 0x80) |
                                                                  (uint)!(bool)(bVar35 & 1) *
                                                                  auVar48._0_4_))));
                }
                break;
              }
              uVar31 = 0;
              auVar92 = ZEXT1664(auVar129._0_16_);
              sVar24 = 8;
              uVar38 = 0;
              do {
                sVar23 = *(size_t *)((sVar27 & 0xfffffffffffffff0) + uVar38 * 8);
                sVar28 = sVar24;
                if (sVar23 != 8) {
                  uVar8 = *(undefined4 *)(sVar27 + 0x40 + uVar38 * 4);
                  auVar98._4_4_ = uVar8;
                  auVar98._0_4_ = uVar8;
                  auVar98._8_4_ = uVar8;
                  auVar98._12_4_ = uVar8;
                  auVar47 = vfmadd132ps_fma(auVar98,local_3548,local_34f8);
                  uVar8 = *(undefined4 *)(sVar27 + 0x80 + uVar38 * 4);
                  auVar101._4_4_ = uVar8;
                  auVar101._0_4_ = uVar8;
                  auVar101._8_4_ = uVar8;
                  auVar101._12_4_ = uVar8;
                  auVar44 = vfmadd132ps_avx512vl(auVar101,local_3558,local_3508);
                  uVar8 = *(undefined4 *)(sVar27 + 0xc0 + uVar38 * 4);
                  auVar104._4_4_ = uVar8;
                  auVar104._0_4_ = uVar8;
                  auVar104._8_4_ = uVar8;
                  auVar104._12_4_ = uVar8;
                  auVar49 = vfmadd132ps_avx512vl(auVar104,local_3568,local_3518);
                  uVar8 = *(undefined4 *)(sVar27 + 0x60 + uVar38 * 4);
                  auVar108._4_4_ = uVar8;
                  auVar108._0_4_ = uVar8;
                  auVar108._8_4_ = uVar8;
                  auVar108._12_4_ = uVar8;
                  auVar42 = vfmadd132ps_fma(auVar108,local_3548,local_34f8);
                  uVar8 = *(undefined4 *)(sVar27 + 0xa0 + uVar38 * 4);
                  auVar114._4_4_ = uVar8;
                  auVar114._0_4_ = uVar8;
                  auVar114._8_4_ = uVar8;
                  auVar114._12_4_ = uVar8;
                  auVar50 = vfmadd132ps_avx512vl(auVar114,local_3558,local_3508);
                  uVar8 = *(undefined4 *)(sVar27 + 0xe0 + uVar38 * 4);
                  auVar116._4_4_ = uVar8;
                  auVar116._0_4_ = uVar8;
                  auVar116._8_4_ = uVar8;
                  auVar116._12_4_ = uVar8;
                  auVar51 = vfmadd132ps_avx512vl(auVar116,local_3568,local_3518);
                  auVar46 = vpminsd_avx(auVar47,auVar42);
                  auVar52 = vpminsd_avx(auVar44,auVar50);
                  auVar46 = vpmaxsd_avx(auVar46,auVar52);
                  auVar52 = vpminsd_avx(auVar49,auVar51);
                  auVar46 = vpmaxsd_avx(auVar46,auVar52);
                  auVar52 = vpmaxsd_avx(auVar47,auVar42);
                  auVar47 = vpmaxsd_avx(auVar44,auVar50);
                  auVar42 = vpminsd_avx(auVar52,auVar47);
                  auVar52 = vpmaxsd_avx(auVar49,auVar51);
                  auVar47 = vpmaxsd_avx(auVar46,local_3528);
                  auVar52 = vpminsd_avx(auVar52,auVar48);
                  auVar52 = vpminsd_avx(auVar42,auVar52);
                  uVar39 = vpcmpd_avx512vl(auVar47,auVar52,2);
                  uVar39 = uVar39 & 0xf;
                  if ((byte)uVar39 != 0) {
                    auVar52 = vblendmps_avx512vl(auVar129._0_16_,auVar46);
                    bVar34 = (bool)((byte)uVar39 & 1);
                    aVar53._0_4_ = (uint)bVar34 * auVar52._0_4_ | (uint)!bVar34 * auVar46._0_4_;
                    bVar34 = (bool)((byte)(uVar39 >> 1) & 1);
                    aVar53._4_4_ = (uint)bVar34 * auVar52._4_4_ | (uint)!bVar34 * auVar46._4_4_;
                    bVar34 = (bool)((byte)(uVar39 >> 2) & 1);
                    aVar53._8_4_ = (uint)bVar34 * auVar52._8_4_ | (uint)!bVar34 * auVar46._8_4_;
                    bVar34 = SUB81(uVar39 >> 3,0);
                    aVar53._12_4_ = (uint)bVar34 * auVar52._12_4_ | (uint)!bVar34 * auVar46._12_4_;
                    aVar86 = auVar92._0_16_;
                    uVar18 = vcmpps_avx512vl((undefined1  [16])aVar53,(undefined1  [16])aVar86,1);
                    sVar29 = sVar23;
                    aVar11 = aVar86;
                    aVar22 = aVar53;
                    if (((char)uVar18 == '\0') ||
                       (sVar28 = sVar23, sVar29 = sVar24, aVar11 = aVar53, aVar22 = aVar86,
                       sVar24 != 8)) {
                      uVar31 = uVar31 + 1;
                      pNVar32->ptr = sVar29;
                      pNVar32 = pNVar32 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar33->v = aVar22;
                      paVar33 = paVar33 + 1;
                      auVar92 = ZEXT1664((undefined1  [16])aVar11);
                    }
                    else {
                      auVar92 = ZEXT1664((undefined1  [16])aVar53);
                    }
                  }
                }
              } while ((sVar23 != 8) &&
                      (bVar34 = uVar38 < 7, sVar24 = sVar28, uVar38 = uVar38 + 1, bVar34));
              if (1 < uVar31 && sVar28 != 8) {
                aVar11 = paVar33[-2];
                uVar18 = vcmpps_avx512vl((undefined1  [16])aVar11,(undefined1  [16])paVar33[-1],1);
                if ((char)uVar18 != '\0') {
                  paVar33[-2] = paVar33[-1];
                  paVar33[-1] = aVar11;
                  auVar46 = vpermilps_avx(*(undefined1 (*) [16])(pNVar32 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar32 + -2) = auVar46;
                }
                if (uVar31 != 2) {
                  aVar11 = paVar33[-3];
                  uVar18 = vcmpps_avx512vl((undefined1  [16])aVar11,(undefined1  [16])paVar33[-1],1)
                  ;
                  if ((char)uVar18 != '\0') {
                    paVar33[-3] = paVar33[-1];
                    paVar33[-1] = aVar11;
                    sVar27 = pNVar32[-3].ptr;
                    pNVar32[-3].ptr = pNVar32[-1].ptr;
                    pNVar32[-1].ptr = sVar27;
                  }
                  aVar11 = paVar33[-3];
                  uVar18 = vcmpps_avx512vl((undefined1  [16])aVar11,(undefined1  [16])paVar33[-2],1)
                  ;
                  if ((char)uVar18 != '\0') {
                    paVar33[-3] = paVar33[-2];
                    paVar33[-2] = aVar11;
                    auVar46 = vpermilps_avx(*(undefined1 (*) [16])(pNVar32 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar32 + -3) = auVar46;
                  }
                }
              }
              sVar27 = sVar28;
            } while (sVar28 != 8);
          }
          bVar12 = false;
        }
LAB_00824f32:
      } while (!bVar12);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }